

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

char * flatcc_verify_error_string(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "ok";
    break;
  case 1:
    pcStack_10 = "buffer header too small";
    break;
  case 2:
    pcStack_10 = "identifier mismatch";
    break;
  case 3:
    pcStack_10 = "max nesting level reached";
    break;
  case 4:
    pcStack_10 = "required field missing";
    break;
  case 5:
    pcStack_10 = "runtime: buffer header not aligned";
    break;
  case 6:
    pcStack_10 = "runtime: buffer size too large";
    break;
  case 7:
    pcStack_10 = "string not zero terminated";
    break;
  case 8:
    pcStack_10 = "string out of range";
    break;
  case 9:
    pcStack_10 = "struct out of range";
    break;
  case 10:
    pcStack_10 = "struct size overflow";
    break;
  case 0xb:
    pcStack_10 = "struct unaligned";
    break;
  case 0xc:
    pcStack_10 = "table field not aligned";
    break;
  case 0xd:
    pcStack_10 = "table field out of range";
    break;
  case 0xe:
    pcStack_10 = "table field size overflow";
    break;
  case 0xf:
    pcStack_10 = "table header out of range or unaligned";
    break;
  case 0x10:
    pcStack_10 = "vector header out of range or unaligned";
    break;
  case 0x11:
    pcStack_10 = "string header out of range or unaligned";
    break;
  case 0x12:
    pcStack_10 = "offset out of range";
    break;
  case 0x13:
    pcStack_10 = "table offset out of range or unaligned";
    break;
  case 0x14:
    pcStack_10 = "table size out of range";
    break;
  case 0x15:
    pcStack_10 = "type field absent from required union field";
    break;
  case 0x16:
    pcStack_10 = "type field absent from required union vector field";
    break;
  case 0x17:
    pcStack_10 = "union cannot have a table without a type";
    break;
  case 0x18:
    pcStack_10 = "union value field present with type NONE";
    break;
  case 0x19:
    pcStack_10 = "vector count exceeds representable vector size";
    break;
  case 0x1a:
    pcStack_10 = "vector out of range";
    break;
  case 0x1b:
    pcStack_10 = "vtable header out of range";
    break;
  case 0x1c:
    pcStack_10 = "vtable header too small";
    break;
  case 0x1d:
    pcStack_10 = "vtable offset out of range or unaligned";
    break;
  case 0x1e:
    pcStack_10 = "vtable size out of range or unaligned";
    break;
  case 0x1f:
    pcStack_10 = "vtable size overflow";
    break;
  case 0x20:
    pcStack_10 = "union element absent without type NONE";
    break;
  case 0x21:
    pcStack_10 = "union element present with type NONE";
    break;
  case 0x22:
    pcStack_10 = "union type and table vectors have different lengths";
    break;
  case 0x23:
    pcStack_10 = "union vector verification not supported";
    break;
  case 0x24:
    pcStack_10 = "runtime buffer size less than buffer headers size field";
    break;
  case 0x25:
    pcStack_10 = "not supported";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *flatcc_verify_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_verify_error_##no:                                          \
        return str;
        FLATCC_VERIFY_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}